

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_util.c
# Opt level: O0

int ImgIoUtilWriteFile(char *file_name,uint8_t *data,size_t data_size)

{
  int iVar1;
  size_t sVar2;
  size_t in_RDX;
  void *in_RSI;
  char *in_RDI;
  bool bVar3;
  int to_stdout;
  FILE *out;
  int ok;
  FILE *local_40;
  uint local_4;
  
  bVar3 = true;
  if (in_RDI != (char *)0x0) {
    iVar1 = strcmp(in_RDI,"-");
    bVar3 = iVar1 == 0;
  }
  if (in_RSI == (void *)0x0) {
    local_4 = 0;
  }
  else {
    if (bVar3) {
      local_40 = (FILE *)ImgIoUtilSetBinaryMode((FILE *)_stdout);
    }
    else {
      local_40 = fopen(in_RDI,"wb");
    }
    if (local_40 == (FILE *)0x0) {
      fprintf(_stderr,"Error! Cannot open output file \'%s\'\n",in_RDI);
      local_4 = 0;
    }
    else {
      sVar2 = fwrite(in_RSI,in_RDX,1,local_40);
      local_4 = (uint)(sVar2 == 1);
      if (local_40 != _stdout) {
        fclose(local_40);
      }
    }
  }
  return local_4;
}

Assistant:

int ImgIoUtilWriteFile(const char* const file_name,
                       const uint8_t* data, size_t data_size) {
  int ok;
  FILE* out;
  const int to_stdout = (file_name == NULL) || !WSTRCMP(file_name, "-");

  if (data == NULL) {
    return 0;
  }
  out = to_stdout ? ImgIoUtilSetBinaryMode(stdout) : WFOPEN(file_name, "wb");
  if (out == NULL) {
    WFPRINTF(stderr, "Error! Cannot open output file '%s'\n",
             (const W_CHAR*)file_name);
    return 0;
  }
  ok = (fwrite(data, data_size, 1, out) == 1);
  if (out != stdout) fclose(out);
  return ok;
}